

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *local_58;
  bool local_4b;
  bool local_4a;
  byte local_49;
  ImGuiWindow *local_48;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  byte local_19;
  ImGuiWindow *pIStack_18;
  bool is_closed_popup;
  ImGuiWindow *root_window;
  ImGuiContext *g;
  
  root_window = (ImGuiWindow *)GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      if (GImGui->HoveredWindow == (ImGuiWindow *)0x0) {
        local_48 = (ImGuiWindow *)0x0;
      }
      else {
        local_48 = GImGui->HoveredWindow->RootWindow;
      }
      pIStack_18 = local_48;
      local_49 = 0;
      if ((local_48 != (ImGuiWindow *)0x0) && (local_49 = 0, (local_48->Flags & 0x4000000U) != 0)) {
        bVar3 = IsPopupOpen(local_48->PopupId,0x100);
        local_49 = bVar3 ^ 0xff;
      }
      local_19 = local_49 & 1;
      if ((pIStack_18 == (ImGuiWindow *)0x0) || (local_19 != 0)) {
        if ((pIStack_18 == (ImGuiWindow *)0x0) &&
           ((lVar1._0_4_ = root_window[0xf].FontWindowScale,
            lVar1._4_4_ = root_window[0xf].FontDpiScale, lVar1 != 0 &&
            (pIVar4 = GetTopMostPopupModal(), pIVar4 == (ImGuiWindow *)0x0)))) {
          FocusWindow((ImGuiWindow *)0x0);
        }
      }
      else {
        StartMouseMovingWindow
                  (*(ImGuiWindow **)&root_window[0xf].WindowClass.DockNodeFlagsOverrideSet);
        if ((((uint)(root_window->WindowPadding).y & 0x10000) != 0) &&
           (((pIStack_18->Flags & 1U) == 0 || ((pIStack_18->field_0x3f9 & 1) != 0)))) {
          join_0x00001240_0x00001200_ = ImGuiWindow::TitleBarRect(pIStack_18);
          bVar3 = ImRect::Contains((ImRect *)((long)&modal + 4),
                                   (ImVec2 *)&root_window[0xc].DrawListInst._Splitter._Count);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            *(undefined8 *)&root_window[0xf].ViewportPos.y = 0;
          }
        }
        if (((uint)root_window[0xf].ContentSizeIdeal.x & 0x1000000) != 0) {
          *(undefined8 *)&root_window[0xf].ViewportPos.y = 0;
        }
      }
    }
    if (((ulong)root_window[0xc].NavLastChildNavWindow & 0x100) != 0) {
      local_58 = GetTopMostPopupModal();
      lVar2._0_4_ = root_window[0xf].WindowClass.DockNodeFlagsOverrideSet;
      lVar2._4_1_ = root_window[0xf].WindowClass.DockingAlwaysTabBar;
      lVar2._5_1_ = root_window[0xf].WindowClass.DockingAllowUnclassed;
      lVar2._6_2_ = *(undefined2 *)&root_window[0xf].WindowClass.field_0x1a;
      local_4a = false;
      if (lVar2 != 0) {
        local_4b = true;
        if (local_58 != (ImGuiWindow *)0x0) {
          local_4b = IsWindowAbove(*(ImGuiWindow **)
                                    &root_window[0xf].WindowClass.DockNodeFlagsOverrideSet,local_58)
          ;
        }
        local_4a = local_4b;
      }
      if (local_4a != false) {
        local_58 = *(ImGuiWindow **)&root_window[0xf].WindowClass.DockNodeFlagsOverrideSet;
      }
      ClosePopupsOverWindow(local_58,true);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets, so e.g. clicking on docking tab-bar which have set HoveredId already and not get us here!)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly)
                if (!(root_window->Flags & ImGuiWindowFlags_NoTitleBar) || root_window->DockIsActive)
                    if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                        g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && (modal == NULL || IsWindowAbove(g.HoveredWindow, modal));
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}